

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O1

void __thiscall raspicam::_private::Private_Impl_Still::commitSharpness(Private_Impl_Still *this)

{
  char *__s;
  MMAL_STATUS_T MVar1;
  size_t sVar2;
  
  MVar1 = mmal_port_parameter_set_rational
                    (this->camera->control,0x1002c,
                     (MMAL_RATIONAL_T)((ulong)(uint)this->sharpness | 0x6400000000));
  if (MVar1 != MMAL_SUCCESS) {
    __s = this->API_NAME;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": Failed to set sharpness parameter.\n",0x25);
    return;
  }
  return;
}

Assistant:

void Private_Impl_Still::commitSharpness() {
            if ( mmal_port_parameter_set_rational ( camera->control, MMAL_PARAMETER_SHARPNESS, ( MMAL_RATIONAL_T ) {
            sharpness, 100
        } ) != MMAL_SUCCESS )
            cout << API_NAME << ": Failed to set sharpness parameter.\n";
        }